

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O3

void __thiscall si9ma::SinglyLinkedList::insert(SinglyLinkedList *this,int val,int index)

{
  int iVar1;
  SinglyNodeWithRand *this_00;
  SinglyNodeWithRand *node;
  SinglyLinkedList *pSVar2;
  
  this_00 = (SinglyNodeWithRand *)operator_new(0x18);
  SinglyNodeWithRand::SinglyNodeWithRand(this_00,val);
  if (this->size == 0) {
    this->tail = this_00;
    this->head = this_00;
    iVar1 = 1;
  }
  else {
    node = get_node(this,index);
    pSVar2 = this;
    if (node != this->head) {
      pSVar2 = (SinglyLinkedList *)get_prev(this,node);
    }
    pSVar2->head = this_00;
    this_00->next = node;
    iVar1 = this->size + 1;
  }
  this->size = iVar1;
  return;
}

Assistant:

void SinglyLinkedList::insert(int val, int index) {
        auto *new_node = new SinglyNodeWithRand(val);

        if (is_empty()){
            head = tail = new_node;
            size++;
            return;
        }

        auto *old_node = get_node(index);
        if (old_node == head){
            head = new_node;
            new_node->next = old_node;
        } else{
            SinglyNodeWithRand *prev = get_prev(old_node);
            prev->next = new_node;
            new_node->next = old_node;
        }

        size++;
    }